

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O2

Type * __thiscall
google::protobuf::util::converter::anon_unknown_0::TypeInfoForTypeResolver::GetTypeByTypeUrl
          (TypeInfoForTypeResolver *this,StringPiece type_url)

{
  Type **ppTVar1;
  Type *pTVar2;
  undefined1 local_40 [8];
  StatusOrType result;
  
  (*(this->super_TypeInfo)._vptr_TypeInfo[2])(local_40,this,type_url.ptr_,type_url.length_);
  if (local_40._0_4_ == OK) {
    ppTVar1 = StatusOr<const_google::protobuf::Type_*>::value
                        ((StatusOr<const_google::protobuf::Type_*> *)local_40);
    pTVar2 = *ppTVar1;
  }
  else {
    pTVar2 = (Type *)0x0;
  }
  std::__cxx11::string::~string((string *)&result);
  return pTVar2;
}

Assistant:

const google::protobuf::Type* GetTypeByTypeUrl(
      StringPiece type_url) const override {
    StatusOrType result = ResolveTypeUrl(type_url);
    return result.ok() ? result.value() : NULL;
  }